

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_bn2lebinpad(BIGNUM *a,uchar *to,int tolen)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  BIGNUM *in_RDI;
  unsigned_long l;
  int i;
  int local_20;
  undefined1 *local_18;
  int local_4;
  
  iVar1 = BN_num_bits(in_RDI);
  local_20 = (iVar1 + 7) / 8;
  if (in_EDX < local_20) {
    local_4 = -1;
  }
  else {
    if (local_20 < in_EDX) {
      memset((void *)(in_RSI + local_20),0,(long)(in_EDX - local_20));
    }
    local_18 = (undefined1 *)(in_RSI + local_20);
    while (iVar1 = local_20 + -1, local_4 = in_EDX, local_20 != 0) {
      local_18 = local_18 + -1;
      *local_18 = (char)(in_RDI->d[iVar1 / 8] >> ((byte)(iVar1 % 8 << 3) & 0x3f));
      local_20 = iVar1;
    }
  }
  return local_4;
}

Assistant:

int BN_bn2lebinpad(const BIGNUM *a, unsigned char *to, int tolen)
{
    int i;
    BN_ULONG l;
    bn_check_top(a);
    i = BN_num_bytes(a);
    if (tolen < i)
        return -1;
    /* Add trailing zeroes if necessary */
    if (tolen > i)
        memset(to + i, 0, tolen - i);
    to += i;
    while (i--) {
        l = a->d[i / BN_BYTES];
        to--;
        *to = (unsigned char)(l >> (8 * (i % BN_BYTES))) & 0xff;
    }
    return tolen;
}